

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O3

ANNpoint annAllocPt(int dim,ANNcoord c)

{
  undefined1 auVar1 [16];
  ANNpoint pAVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar3 = (ulong)(uint)dim * 8;
  }
  pAVar2 = (ANNpoint)operator_new__(uVar3);
  auVar1 = _DAT_0010a260;
  if (0 < dim) {
    lVar4 = (ulong)(uint)dim - 1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar5 = auVar5 ^ _DAT_0010a260;
    auVar6 = _DAT_0010a090;
    do {
      auVar8 = auVar6 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(ANNcoord *)((long)pAVar2 + lVar4) = c;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(ANNcoord *)((long)pAVar2 + lVar4 + 8) = c;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(dim + 1U >> 1) << 4 != lVar4);
  }
  return pAVar2;
}

Assistant:

ANNpoint annAllocPt(int dim, ANNcoord c)  // allocate 1 point
{
    ANNpoint p = new ANNcoord[dim];
    for (int i = 0; i < dim; i++) p[i] = c;
    return p;
}